

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

int __thiscall JetHead::Path::remove(Path *this,char *__filename)

{
  int iVar1;
  ErrCode EVar2;
  int *piVar3;
  stat buf;
  stat sStack_98;
  
  iVar1 = stat((this->mPath)._M_dataplus._M_p,&sStack_98);
  if ((iVar1 == 0) && ((sStack_98.st_mode._1_1_ & 0x40) != 0)) {
    iVar1 = rmdir((this->mPath)._M_dataplus._M_p);
  }
  else {
    iVar1 = unlink((this->mPath)._M_dataplus._M_p);
  }
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    EVar2 = getErrorCode(*piVar3);
    return EVar2;
  }
  return 0;
}

Assistant:

ErrCode Path::remove()
{
	int res = 0;
	if ( isDir() )
	{
		LOG_NOISE( "Removing Dir" );
		res = ::rmdir( mPath.c_str() );
	}
	else
	{
		LOG_NOISE( "Removing File" );
		res = ::unlink( mPath.c_str() );
	}
	
	if ( res != 0 )
	{
		return getErrorCode( errno );
	}
	
	return kNoError;
}